

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzread(BZFILE *b,void *buf,int len)

{
  uint uVar1;
  int bzerr;
  uint local_c;
  
  uVar1 = 0;
  if (*(int *)((long)b + 0x13e8) != 4) {
    uVar1 = BZ2_bzRead((int *)&local_c,b,buf,len);
    uVar1 = -(uint)((local_c & 0xfffffffb) != 0) | uVar1;
  }
  return uVar1;
}

Assistant:

int BZ2_bzread (BZFILE* b, void* buf, int len )
{
   int bzerr, nread;
   if (((bzFile*)b)->lastErr == BZ_STREAM_END) return 0;
   nread = BZ2_bzRead(&bzerr,b,buf,len);
   if (bzerr == BZ_OK || bzerr == BZ_STREAM_END) {
      return nread;
   } else {
      return -1;
   }
}